

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O3

void __thiscall
QHttp2Connection::registerStreamAsResetLocally(QHttp2Connection *this,quint32 streamID)

{
  QHttp2Connection *this_00;
  ulong uVar1;
  long in_FS_OFFSET;
  quint32 local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this + 0x1d8;
  local_1c = streamID;
  QtPrivate::QPodArrayOps<unsigned_int>::emplace<unsigned_int&>
            ((QPodArrayOps<unsigned_int> *)this_00,*(qsizetype *)(this + 0x1e8),&local_1c);
  QList<unsigned_int>::end((QList<unsigned_int> *)this_00);
  uVar1 = *(ulong *)(this + 0x1e8);
  while (100 < uVar1) {
    QList<unsigned_int>::begin((QList<unsigned_int> *)this_00);
    *(long *)(this + 0x1e0) = *(long *)(this + 0x1e0) + 4;
    uVar1 = *(long *)(this + 0x1e8) - 1;
    *(ulong *)(this + 0x1e8) = uVar1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttp2Connection::registerStreamAsResetLocally(quint32 streamID)
{
    // RFC 9113, 6.4: However, after sending the RST_STREAM, the sending endpoint MUST be prepared
    // to receive and process additional frames sent on the stream that might have been sent by the
    // peer prior to the arrival of the RST_STREAM.

    // Store the last 100 stream ids that were reset locally. Frames received on these streams
    // are still considered valid for some time (Until 100 other streams are reset locally).
    m_resetStreamIDs.append(streamID);
    while (m_resetStreamIDs.size() > 100)
        m_resetStreamIDs.takeFirst();
}